

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_python.cpp
# Opt level: O3

void __thiscall
flatbuffers::python::PythonGenerator::GenVectorInit
          (PythonGenerator *this,FieldDef *field,string *field_type_ptr,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *import_list,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *import_typing_list)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long *plVar2;
  long *plVar3;
  size_type *psVar4;
  undefined8 uVar5;
  _Alloc_hider _Var6;
  string package_reference;
  BaseType base_type;
  string object_type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string local_f8;
  string local_d8;
  BaseType local_b4;
  _Alloc_hider local_b0;
  StructDef *local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_90;
  long local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  long *local_70 [2];
  long local_60 [2];
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
  local_b0._M_p = (pointer)&local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"List","");
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)import_typing_list,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_p != &local_a0) {
    operator_delete(local_b0._M_p,local_a0._M_allocated_capacity + 1);
  }
  local_b4 = (field->value).type.element;
  local_a8 = (field->value).type.struct_def;
  local_a0._M_allocated_capacity = (size_type)(field->value).type.enum_def;
  local_a0._8_2_ = (field->value).type.fixed_length;
  local_b0._M_p._4_4_ = 0;
  local_b0._M_p._0_4_ = local_b4;
  if (local_b4 == BASE_TYPE_STRUCT) {
    (*(this->namer_).super_Namer._vptr_Namer[0x11])(&local_90,&this->namer_);
    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_f8,local_90,(undefined1 *)(local_88 + (long)local_90));
    std::__cxx11::string::append((char *)&local_f8);
    std::__cxx11::string::operator=((string *)field_type_ptr,(string *)&local_f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
    if ((((this->super_BaseGenerator).parser_)->opts).include_dependence_headers == true) {
      GenPackageReference_abi_cxx11_(&local_f8,this,(Type *)&local_b0);
      local_70[0] = local_60;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_70,local_f8._M_dataplus._M_p,
                 local_f8._M_dataplus._M_p + local_f8._M_string_length);
      std::__cxx11::string::append((char *)local_70);
      plVar2 = (long *)std::__cxx11::string::_M_append((char *)local_70,(ulong)local_90);
      plVar3 = plVar2 + 2;
      if ((long *)*plVar2 == plVar3) {
        local_40 = *plVar3;
        lStack_38 = plVar2[3];
        local_50 = &local_40;
      }
      else {
        local_40 = *plVar3;
        local_50 = (long *)*plVar2;
      }
      local_48 = plVar2[1];
      *plVar2 = (long)plVar3;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      plVar2 = (long *)std::__cxx11::string::append((char *)&local_50);
      paVar1 = &local_d8.field_2;
      psVar4 = (size_type *)(plVar2 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar2 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar4) {
        local_d8.field_2._M_allocated_capacity = *psVar4;
        local_d8.field_2._8_8_ = plVar2[3];
        local_d8._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_d8.field_2._M_allocated_capacity = *psVar4;
        local_d8._M_dataplus._M_p = (pointer)*plVar2;
      }
      local_d8._M_string_length = plVar2[1];
      *plVar2 = (long)psVar4;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      std::__cxx11::string::operator=((string *)field_type_ptr,(string *)&local_d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != paVar1) {
        operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
      }
      if (local_50 != &local_40) {
        operator_delete(local_50,local_40 + 1);
      }
      if (local_70[0] != local_60) {
        operator_delete(local_70[0],local_60[0] + 1);
      }
      std::operator+(&local_d8,"import ",&local_f8);
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)import_list,&local_d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != paVar1) {
        operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
      }
    }
    std::operator+(&local_f8,"List[",field_type_ptr);
    std::__cxx11::string::operator=((string *)field_type_ptr,(string *)&local_f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
    uVar5 = local_80._M_allocated_capacity;
    _Var6._M_p = (pointer)local_90;
    if (local_90 == &local_80) {
      return;
    }
  }
  else {
    GetBasePythonTypeForScalarAndString_abi_cxx11_(&local_d8,this,&local_b4);
    plVar2 = (long *)std::__cxx11::string::replace((ulong)&local_d8,0,(char *)0x0,0x371c15);
    psVar4 = (size_type *)(plVar2 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar2 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar4) {
      local_f8.field_2._M_allocated_capacity = *psVar4;
      local_f8.field_2._8_8_ = plVar2[3];
      local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    }
    else {
      local_f8.field_2._M_allocated_capacity = *psVar4;
      local_f8._M_dataplus._M_p = (pointer)*plVar2;
    }
    local_f8._M_string_length = plVar2[1];
    *plVar2 = (long)psVar4;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_f8);
    psVar4 = (size_type *)(plVar2 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar2 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar4) {
      local_80._M_allocated_capacity = *psVar4;
      local_80._8_8_ = plVar2[3];
      local_90 = &local_80;
    }
    else {
      local_80._M_allocated_capacity = *psVar4;
      local_90 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*plVar2;
    }
    local_88 = plVar2[1];
    *plVar2 = (long)psVar4;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    std::__cxx11::string::operator=((string *)field_type_ptr,(string *)&local_90);
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
    uVar5 = local_d8.field_2._M_allocated_capacity;
    _Var6._M_p = local_d8._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p == &local_d8.field_2) {
      return;
    }
  }
  operator_delete(_Var6._M_p,uVar5 + 1);
  return;
}

Assistant:

void GenVectorInit(const FieldDef &field, std::string *field_type_ptr,
                     std::set<std::string> *import_list,
                     std::set<std::string> *import_typing_list) const {
    import_typing_list->insert("List");
    auto &field_type = *field_type_ptr;
    const Type &vector_type = field.value.type.VectorType();
    const BaseType base_type = vector_type.base_type;
    if (base_type == BASE_TYPE_STRUCT) {
      const std::string object_type =
          namer_.ObjectType(*vector_type.struct_def);
      field_type = object_type + "]";
      if (parser_.opts.include_dependence_headers) {
        auto package_reference = GenPackageReference(vector_type);
        field_type = package_reference + "." + object_type + "]";
        import_list->insert("import " + package_reference);
      }
      field_type = "List[" + field_type;
    } else {
      field_type =
          "List[" + GetBasePythonTypeForScalarAndString(base_type) + "]";
    }
  }